

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall
backward::TraceResolverLinuxBase::TraceResolverLinuxBase(TraceResolverLinuxBase *this)

{
  allocator local_39;
  string local_38;
  
  (this->super_TraceResolverImplBase)._demangler.
  super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer._val = (char *)0x0;
  (this->super_TraceResolverImplBase)._demangler.
  super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer._empty = true;
  (this->super_TraceResolverImplBase)._demangler.
  super_demangler_impl<backward::system_tag::linux_tag>._demangle_buffer_length = 0;
  (this->super_TraceResolverImplBase)._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverLinuxBase_0014fc50;
  get_argv0_abi_cxx11_();
  std::__cxx11::string::string((string *)&local_38,"/proc/self/exe",&local_39);
  read_symlink(&this->exec_path_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

TraceResolverLinuxBase()
      : argv0_(get_argv0()), exec_path_(read_symlink("/proc/self/exe")) {}